

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O2

long duckdb::Cast::Operation<duckdb::string_t,long>(string_t input)

{
  string_t input_00;
  bool bVar1;
  InvalidInputException *this;
  PhysicalType type;
  bool in_R8B;
  string_t input_01;
  long result;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  input_01.value._0_8_ = input.value._8_8_;
  input_01.value.pointer.ptr = (char *)&result;
  bVar1 = TryCast::Operation<duckdb::string_t,long>
                    (input.value._0_8_,input_01,(int64_t *)0x0,in_R8B);
  if (bVar1) {
    return result;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.value.pointer.ptr = (char *)result;
  input_00.value._0_8_ = 0x12bf0e4;
  ConvertToString::Operation<duckdb::string_t>(input_00);
  ::std::operator+(&local_80,"Could not convert string \'",&local_a0);
  ::std::operator+(&local_60,&local_80,"\' to ");
  TypeIdToString_abi_cxx11_(&local_c0,(duckdb *)0x9,type);
  ::std::operator+(&local_40,&local_60,&local_c0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}